

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MinimizerParameters.cpp
# Opt level: O0

void __thiscall OpenMD::MinimizerParameters::~MinimizerParameters(MinimizerParameters *this)

{
  DataHolder *in_RDI;
  
  ((ParameterBase *)&in_RDI->_vptr_DataHolder)->_vptr_ParameterBase =
       (_func_int **)&PTR__MinimizerParameters_0034c210;
  Parameter<double>::~Parameter((Parameter<double> *)0x2329fd);
  Parameter<double>::~Parameter((Parameter<double> *)0x232a0e);
  Parameter<double>::~Parameter((Parameter<double> *)0x232a1f);
  Parameter<double>::~Parameter((Parameter<double> *)0x232a30);
  Parameter<int>::~Parameter((Parameter<int> *)0x232a41);
  Parameter<int>::~Parameter((Parameter<int> *)0x232a52);
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~Parameter((Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_RDI);
  Parameter<bool>::~Parameter((Parameter<bool> *)0x232a71);
  DataHolder::~DataHolder(in_RDI);
  return;
}

Assistant:

MinimizerParameters::~MinimizerParameters() {}